

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O1

void __thiscall helics::ipc::IpcComms::queue_tx_function(IpcComms *this)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined7 uVar5;
  undefined7 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  int *piVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  uint priority;
  int iVar15;
  _Rb_tree_header *p_Var16;
  SendToQueue *pSVar17;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  pVar18;
  ActionMessage err;
  map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  routes;
  SendToQueue rxQueue;
  SendToQueue brokerQueue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_318;
  size_type sStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f0 [8];
  _Alloc_hider local_2e8;
  undefined1 local_2e0 [24];
  _Alloc_hider local_2c8;
  Time local_2c0;
  undefined1 local_2b8 [16];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  pointer local_288;
  byte bStack_280;
  byte abStack_27f [15];
  bool bStack_270;
  byte abStack_26f [15];
  byte *local_260;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_230;
  undefined1 local_228 [32];
  Time TStack_208;
  Time local_200;
  Time TStack_1f8;
  Time local_1f0;
  byte abStack_1e8 [64];
  size_t sStack_1a8;
  size_t local_1a0;
  byte *local_198;
  undefined8 local_190;
  pointer pbStack_188;
  pointer local_180;
  pointer pbStack_178;
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  local_170;
  SendToQueue local_140;
  SendToQueue local_b8;
  
  bVar3 = false;
  local_b8.connectionNameOrig._M_dataplus._M_p = (pointer)&local_b8.connectionNameOrig.field_2;
  local_b8.txqueue._M_t.
  super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  .
  super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          )0x0;
  local_b8.connectionNameOrig._M_string_length = 0;
  local_b8.connectionNameOrig.field_2._M_local_buf[0] = '\0';
  local_b8.connectionName._M_dataplus._M_p = (pointer)&local_b8.connectionName.field_2;
  local_b8.connectionName._M_string_length = 0;
  local_b8.connectionName.field_2._M_local_buf[0] = '\0';
  local_b8.errorString._M_dataplus._M_p = (pointer)&local_b8.errorString.field_2;
  local_b8.errorString._M_string_length = 0;
  local_b8.errorString.field_2._M_local_buf[0] = '\0';
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = 0;
  local_b8.connected = false;
  local_140.connectionNameOrig._M_dataplus._M_p = (pointer)&local_140.connectionNameOrig.field_2;
  local_140.txqueue._M_t.
  super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  .
  super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          )0x0;
  local_140.connectionNameOrig._M_string_length = 0;
  local_140.connectionNameOrig.field_2._M_local_buf[0] = '\0';
  local_140.connectionName._M_dataplus._M_p = (pointer)&local_140.connectionName.field_2;
  local_140.connectionName._M_string_length = 0;
  local_140.connectionName.field_2._M_local_buf[0] = '\0';
  local_140.errorString._M_dataplus._M_p = (pointer)&local_140.errorString.field_2;
  local_140.errorString._M_string_length = 0;
  local_140.errorString.field_2._M_local_buf[0] = '\0';
  local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = 0;
  local_140.connected = false;
  local_170._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_170._M_impl.super__Rb_tree_header._M_header;
  local_170._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_170._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_170._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170._M_impl.super__Rb_tree_header._M_header._M_right =
       local_170._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->super_CommsInterface).brokerTargetAddress._M_string_length != 0) {
    iVar15 = (int)this + 0x110;
    iVar11 = SendToQueue::connect(&local_b8,iVar15,(sockaddr *)0x1,0x14);
    bVar3 = true;
    if ((char)iVar11 == '\0') {
      uVar2 = (this->super_CommsInterface).connectionTimeout.__r;
      if (0 < (long)uVar2) {
        local_2f0 = (undefined1  [8])(uVar2 / 1000);
        local_2e8._M_p = (pointer)((uVar2 % 1000) * 1000000);
        do {
          iVar11 = nanosleep((timespec *)local_2f0,(timespec *)local_2f0);
          if (iVar11 != -1) break;
          piVar12 = __errno_location();
        } while (*piVar12 == 4);
      }
      iVar11 = SendToQueue::connect(&local_b8,iVar15,(sockaddr *)0x1,0x14);
      bVar3 = true;
      if ((char)iVar11 == '\0') {
        ActionMessage::ActionMessage((ActionMessage *)local_2f0,cmd_error);
        local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8.errorString._M_dataplus._M_p;
        sStack_310 = local_b8.errorString._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x26;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_318;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_228,(v11 *)"Unable to open broker connection -> {}",fmt,args);
        uVar8 = local_228._8_8_;
        uVar7 = local_228._0_8_;
        bStack_270 = SUB81(local_228._8_8_,0);
        abStack_26f._0_7_ = SUB87(local_228._8_8_,1);
        if (((byte *)local_228._0_8_ != local_260) &&
           (SmallBuffer::reserve((SmallBuffer *)(local_2b8 + 8),local_228._8_8_), uVar8 != 0)) {
          memcpy(local_260,(void *)uVar7,uVar8);
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        local_2f0._4_4_ = 0xfffffffe;
        if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
            (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->super_CommsInterface).ActionCallback._M_invoker)
                  ((_Any_data *)&(this->super_CommsInterface).ActionCallback,
                   (ActionMessage *)local_2f0);
        CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
        ActionMessage::~ActionMessage((ActionMessage *)local_2f0);
        bVar3 = false;
      }
    }
    if (!bVar3) goto LAB_002bf386;
  }
  bVar9 = gmlc::concurrency::TriggerVariable::wait_forActivation
                    (&(this->super_CommsInterface).rxTrigger,
                     &(this->super_CommsInterface).connectionTimeout);
  if (bVar9) {
    if ((this->super_CommsInterface).rxStatus._M_i == ERRORED) {
      CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
      goto LAB_002bf386;
    }
    iVar15 = (int)this + 0xf0;
    iVar11 = SendToQueue::connect(&local_140,iVar15,(sockaddr *)0x0,0);
    if ((char)iVar11 == '\0') {
      LOCK();
      (this->ipcbackchannel).super___atomic_base<int>._M_i = 2;
      UNLOCK();
      if ((this->ipcbackchannel).super___atomic_base<int>._M_i != 0) {
        do {
          if ((this->super_CommsInterface).rxStatus._M_i != CONNECTED) break;
          local_2f0 = (undefined1  [8])0x0;
          local_2e8._M_p = (pointer)0x5f5e100;
          do {
            iVar11 = nanosleep((timespec *)local_2f0,(timespec *)local_2f0);
            if (iVar11 != -1) break;
            piVar12 = __errno_location();
          } while (*piVar12 == 4);
        } while ((this->ipcbackchannel).super___atomic_base<int>._M_i != 0);
      }
      cVar10 = '\0';
      if ((this->super_CommsInterface).rxStatus._M_i == CONNECTED) {
        iVar11 = SendToQueue::connect(&local_140,iVar15,(sockaddr *)0x0,0);
        cVar10 = (char)iVar11;
      }
      if (cVar10 == '\0') {
        ActionMessage::ActionMessage((ActionMessage *)local_2f0,cmd_error);
        local_2f0._4_4_ = 0xfffffffe;
        local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140.errorString._M_dataplus._M_p;
        sStack_310 = local_140.errorString._M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x28;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_318;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)local_228,(v11 *)"Unable to open receiver connection -> {}",fmt_00,
                   args_00);
        uVar8 = local_228._8_8_;
        uVar7 = local_228._0_8_;
        uVar5 = abStack_26f._0_7_;
        bVar3 = bStack_270;
        bStack_270 = SUB81(local_228._8_8_,0);
        bVar9 = bStack_270;
        abStack_26f._0_7_ = SUB87(local_228._8_8_,1);
        uVar6 = abStack_26f._0_7_;
        bStack_270 = bVar9;
        abStack_26f._0_7_ = uVar6;
        if (((byte *)local_228._0_8_ != local_260) &&
           (bStack_270 = bVar3, abStack_26f._0_7_ = uVar5,
           SmallBuffer::reserve((SmallBuffer *)(local_2b8 + 8),local_228._8_8_), bStack_270 = bVar9,
           abStack_26f._0_7_ = uVar6, uVar8 != 0)) {
          memcpy(local_260,(void *)uVar7,uVar8);
        }
        if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
          operator_delete((void *)local_228._0_8_,local_228._16_8_ + 1);
        }
        if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
            (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->super_CommsInterface).ActionCallback._M_invoker)
                  ((_Any_data *)&(this->super_CommsInterface).ActionCallback,
                   (ActionMessage *)local_2f0);
        CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
        goto LAB_002beeb0;
      }
    }
    CommsInterface::setTxStatus(&this->super_CommsInterface,CONNECTED);
    local_230 = &(this->super_CommsInterface).txQueue;
    bVar9 = true;
    do {
      local_228._0_8_ = (byte *)0x0;
      local_228._8_8_ = 0x9aac0f0000000000;
      local_228._16_8_ = 0x9aac0f0000000000;
      abStack_1e8[0x38] = 0;
      abStack_1e8[0x39] = 0;
      abStack_1e8[0x3a] = 0;
      abStack_1e8[0x3b] = 0;
      abStack_1e8[0x3c] = 0;
      abStack_1e8[0x3d] = 0;
      abStack_1e8[0x3e] = 0;
      abStack_1e8[0x3f] = 0;
      sStack_1a8 = 0;
      abStack_1e8[0x28] = 0;
      abStack_1e8[0x29] = 0;
      abStack_1e8[0x2a] = 0;
      abStack_1e8[0x2b] = 0;
      abStack_1e8[0x2c] = 0;
      abStack_1e8[0x2d] = 0;
      abStack_1e8[0x2e] = 0;
      abStack_1e8[0x2f] = 0;
      abStack_1e8[0x30] = 0;
      abStack_1e8[0x31] = 0;
      abStack_1e8[0x32] = 0;
      abStack_1e8[0x33] = 0;
      abStack_1e8[0x34] = 0;
      abStack_1e8[0x35] = 0;
      abStack_1e8[0x36] = 0;
      abStack_1e8[0x37] = 0;
      abStack_1e8[0x18] = 0;
      abStack_1e8[0x19] = 0;
      abStack_1e8[0x1a] = 0;
      abStack_1e8[0x1b] = 0;
      abStack_1e8[0x1c] = 0;
      abStack_1e8[0x1d] = 0;
      abStack_1e8[0x1e] = 0;
      abStack_1e8[0x1f] = 0;
      abStack_1e8[0x20] = 0;
      abStack_1e8[0x21] = 0;
      abStack_1e8[0x22] = 0;
      abStack_1e8[0x23] = 0;
      abStack_1e8[0x24] = 0;
      abStack_1e8[0x25] = 0;
      abStack_1e8[0x26] = 0;
      abStack_1e8[0x27] = 0;
      abStack_1e8[8] = 0;
      abStack_1e8[9] = 0;
      abStack_1e8[10] = 0;
      abStack_1e8[0xb] = 0;
      abStack_1e8[0xc] = 0;
      abStack_1e8[0xd] = 0;
      abStack_1e8[0xe] = 0;
      abStack_1e8[0xf] = 0;
      abStack_1e8[0x10] = 0;
      abStack_1e8[0x11] = 0;
      abStack_1e8[0x12] = 0;
      abStack_1e8[0x13] = 0;
      abStack_1e8[0x14] = 0;
      abStack_1e8[0x15] = 0;
      abStack_1e8[0x16] = 0;
      abStack_1e8[0x17] = 0;
      local_1f0.internalTimeCode = 0;
      abStack_1e8[0] = 0;
      abStack_1e8[1] = 0;
      abStack_1e8[2] = 0;
      abStack_1e8[3] = 0;
      abStack_1e8[4] = 0;
      abStack_1e8[5] = 0;
      abStack_1e8[6] = 0;
      abStack_1e8[7] = 0;
      local_200.internalTimeCode = 0;
      TStack_1f8.internalTimeCode = 0;
      local_228._24_8_ = 0;
      TStack_208.internalTimeCode = 0;
      local_1a0 = 0x40;
      local_198 = abStack_1e8;
      local_180 = (pointer)0x0;
      pbStack_178 = (pointer)0x0;
      local_190._0_1_ = false;
      local_190._1_1_ = false;
      local_190._2_1_ = false;
      local_190._3_1_ = '\0';
      local_190._4_4_ = 0;
      pbStack_188 = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_2f0,local_230);
      uVar4 = local_2f0._0_4_;
      ActionMessage::operator=((ActionMessage *)local_228,(ActionMessage *)&local_2e8);
      ActionMessage::~ActionMessage((ActionMessage *)&local_2e8);
      if ((int)local_228._0_4_ < cmd_protocol) {
        if (local_228._0_4_ != cmd_protocol_priority) {
LAB_002bf080:
          if (local_228._0_4_ == cmd_init_grant) {
            ActionMessage::ActionMessage((ActionMessage *)local_2f0,cmd_protocol);
            local_2f0._4_4_ = 0x20fc7;
            SendToQueue::sendMessage(&local_140,(ActionMessage *)local_2f0,3);
            ActionMessage::~ActionMessage((ActionMessage *)local_2f0);
          }
          goto LAB_002bf0b7;
        }
LAB_002bf076:
        if (uVar4 != cmd_broker_setup) goto LAB_002bf080;
        if (local_228._4_4_ == 0xe9) {
          local_2f0 = (undefined1  [8])0x0;
          local_2e8._M_p = local_2e0 + 8;
          local_2e0._0_8_ = 0;
          local_2e0[8] = '\0';
          local_2c8._M_p = local_2b8;
          local_2c0.internalTimeCode = 0;
          local_2b8[0] = '\0';
          local_2a8._M_p = (pointer)&local_298;
          local_2a0 = 0;
          local_298._M_local_buf[0] = 0;
          abStack_27f[7] = 0;
          abStack_27f[8] = 0;
          abStack_27f[9] = 0;
          abStack_27f[10] = 0;
          abStack_27f[0xb] = 0;
          abStack_27f[0xc] = 0;
          abStack_27f[0xd] = 0;
          abStack_27f[0xe] = 0;
          bStack_270 = false;
          local_288 = (pointer)0x0;
          bStack_280 = 0;
          abStack_27f[0] = 0;
          abStack_27f[1] = 0;
          abStack_27f[2] = 0;
          abStack_27f[3] = 0;
          abStack_27f[4] = 0;
          abStack_27f[5] = 0;
          abStack_27f[6] = 0;
          local_318 = &local_308;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_318,local_198,local_198 + sStack_1a8);
          iVar11 = SendToQueue::connect
                             ((SendToQueue *)local_2f0,(int)(string *)&local_318,(sockaddr *)0x0,3);
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308._M_allocated_capacity + 1);
          }
          if ((char)iVar11 != '\0') {
            local_318 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_318._4_4_,local_228._20_4_);
            std::
            _Rb_tree<helics::route_id,std::pair<helics::route_id_const,helics::ipc::SendToQueue>,std::_Select1st<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>>
            ::_M_emplace_unique<helics::route_id,helics::ipc::SendToQueue>
                      ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,helics::ipc::SendToQueue>,std::_Select1st<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>>
                        *)&local_170,(route_id *)&local_318,(SendToQueue *)local_2f0);
          }
          if (local_288 != (pointer)0x0) {
            operator_delete(local_288,CONCAT71(abStack_27f._8_7_,abStack_27f[7]) - (long)local_288);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_p != &local_298) {
            operator_delete(local_2a8._M_p,
                            CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]
                                    ) + 1);
          }
          if (local_2c8._M_p != local_2b8) {
            operator_delete(local_2c8._M_p,CONCAT71(local_2b8._1_7_,local_2b8[0]) + 1);
          }
          if (local_2e8._M_p != local_2e0 + 8) {
            operator_delete(local_2e8._M_p,CONCAT71(local_2e0._9_7_,local_2e0[8]) + 1);
          }
          std::
          unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                         *)local_2f0);
        }
        else if (local_228._4_4_ == 0xf4) {
          local_2f0._0_4_ = local_228._20_4_;
          pVar18 = std::
                   _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                   ::equal_range(&local_170,(key_type *)local_2f0);
          std::
          _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
          ::_M_erase_aux(&local_170,(_Base_ptr)pVar18.first._M_node,(_Base_ptr)pVar18.second._M_node
                        );
        }
        else {
          if (local_228._4_4_ != 0x9db) goto LAB_002bf080;
          bVar9 = false;
        }
      }
      else {
        if ((local_228._0_4_ == cmd_protocol_big) || (local_228._0_4_ == cmd_protocol))
        goto LAB_002bf076;
LAB_002bf0b7:
        ActionMessage::to_string_abi_cxx11_((string *)local_2f0,(ActionMessage *)local_228);
        priority = (uint)local_228._0_4_ >> 0x1e | 1;
        pSVar17 = &local_140;
        if (uVar4 == cmd_broker_setup) {
LAB_002bf0f8:
          SendToQueue::sendMessage(pSVar17,(ActionMessage *)local_228,priority);
        }
        else if (uVar4 == cmd_ignore) {
          pSVar17 = &local_b8;
          if (bVar3) goto LAB_002bf0f8;
        }
        else {
          p_Var13 = &local_170._M_impl.super__Rb_tree_header._M_header;
          for (p_Var14 = local_170._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var14 != (_Rb_tree_header *)0x0;
              p_Var14 = (&p_Var14->_M_left)[(action_t)*(size_t *)(p_Var14 + 1) < (int)uVar4]) {
            if ((int)uVar4 <= (action_t)*(size_t *)(p_Var14 + 1)) {
              p_Var13 = p_Var14;
            }
          }
          p_Var1 = &local_170._M_impl.super__Rb_tree_header;
          p_Var16 = p_Var1;
          if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
             (p_Var16 = (_Rb_tree_header *)p_Var13,
             (int)uVar4 < (action_t)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
            p_Var16 = p_Var1;
          }
          if (p_Var16 == p_Var1) {
            pSVar17 = &local_b8;
            if (!bVar3) goto LAB_002bf1a5;
          }
          else {
            pSVar17 = (SendToQueue *)(p_Var16 + 1);
          }
          SendToQueue::sendMessage(pSVar17,(ActionMessage *)local_228,priority);
        }
LAB_002bf1a5:
        if (local_2f0 != (undefined1  [8])local_2e0) {
          operator_delete((void *)local_2f0,local_2e0._0_8_ + 1);
        }
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_228);
    } while (bVar9);
    CommsInterface::setTxStatus(&this->super_CommsInterface,TERMINATED);
  }
  else {
    ActionMessage::ActionMessage((ActionMessage *)local_2f0,cmd_error);
    local_2f0._4_4_ = 0xfffffffe;
    SmallBuffer::operator=
              ((SmallBuffer *)(local_2b8 + 8),(char (*) [29])"Unable to link with receiver");
    if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_CommsInterface).ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_CommsInterface).ActionCallback,(ActionMessage *)local_2f0)
    ;
    CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
LAB_002beeb0:
    ActionMessage::~ActionMessage((ActionMessage *)local_2f0);
  }
LAB_002bf386:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  ::~_Rb_tree(&local_170);
  if (local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_140.buffer.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_140.buffer.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_140.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.errorString._M_dataplus._M_p != &local_140.errorString.field_2) {
    operator_delete(local_140.errorString._M_dataplus._M_p,
                    CONCAT71(local_140.errorString.field_2._M_allocated_capacity._1_7_,
                             local_140.errorString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.connectionName._M_dataplus._M_p != &local_140.connectionName.field_2) {
    operator_delete(local_140.connectionName._M_dataplus._M_p,
                    CONCAT71(local_140.connectionName.field_2._M_allocated_capacity._1_7_,
                             local_140.connectionName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.connectionNameOrig._M_dataplus._M_p != &local_140.connectionNameOrig.field_2) {
    operator_delete(local_140.connectionNameOrig._M_dataplus._M_p,
                    CONCAT71(local_140.connectionNameOrig.field_2._M_allocated_capacity._1_7_,
                             local_140.connectionNameOrig.field_2._M_local_buf[0]) + 1);
  }
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr(&local_140.txqueue);
  if (local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.errorString._M_dataplus._M_p != &local_b8.errorString.field_2) {
    operator_delete(local_b8.errorString._M_dataplus._M_p,
                    CONCAT71(local_b8.errorString.field_2._M_allocated_capacity._1_7_,
                             local_b8.errorString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.connectionName._M_dataplus._M_p != &local_b8.connectionName.field_2) {
    operator_delete(local_b8.connectionName._M_dataplus._M_p,
                    CONCAT71(local_b8.connectionName.field_2._M_allocated_capacity._1_7_,
                             local_b8.connectionName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.connectionNameOrig._M_dataplus._M_p != &local_b8.connectionNameOrig.field_2) {
    operator_delete(local_b8.connectionNameOrig._M_dataplus._M_p,
                    CONCAT71(local_b8.connectionNameOrig.field_2._M_allocated_capacity._1_7_,
                             local_b8.connectionNameOrig.field_2._M_local_buf[0]) + 1);
  }
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr(&local_b8.txqueue);
  return;
}

Assistant:

void IpcComms::queue_tx_function()
    {
        SendToQueue brokerQueue;  //!< the queue of the broker
        SendToQueue rxQueue;
        std::map<route_id, SendToQueue> routes;  //!< table of the routes to other brokers
        bool hasBroker = false;

        if (!brokerTargetAddress.empty()) {
            bool conn = brokerQueue.connect(brokerTargetAddress, true, 20);
            if (!conn) {
                std::this_thread::sleep_for(connectionTimeout);
                conn = brokerQueue.connect(brokerTargetAddress, true, 20);
                if (!conn) {
                    ActionMessage err(CMD_ERROR);
                    err.payload = fmt::format("Unable to open broker connection -> {}",
                                              brokerQueue.getError());
                    err.messageID = defs::Errors::CONNECTION_FAILURE;
                    ActionCallback(std::move(err));
                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            }
            hasBroker = true;
        }
        // wait for the receiver to STARTUP
        if (!rxTrigger.wait_forActivation(connectionTimeout)) {
            ActionMessage err(CMD_ERROR);
            err.messageID = defs::Errors::CONNECTION_FAILURE;
            err.payload = "Unable to link with receiver";
            ActionCallback(std::move(err));
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        if (getRxStatus() == ConnectionStatus::ERRORED) {
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        bool conn = rxQueue.connect(localTargetAddress, false, 0);
        if (!conn) {
            /** lets try a reset of the receiver*/
            ipcbackchannel = IPC_BACKCHANNEL_TRY_RESET;
            while (ipcbackchannel != 0) {
                if (getRxStatus() != ConnectionStatus::CONNECTED) {
                    break;
                }
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }
            if (getRxStatus() == ConnectionStatus::CONNECTED) {
                conn = rxQueue.connect(localTargetAddress, false, 0);
            }
            if (!conn) {
                ActionMessage err(CMD_ERROR);
                err.messageID = defs::Errors::CONNECTION_FAILURE;
                err.payload =
                    fmt::format("Unable to open receiver connection -> {}", rxQueue.getError());
                ActionCallback(std::move(err));
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }

        setTxStatus(ConnectionStatus::CONNECTED);
        bool IPCoperating = false;
        bool continueLoop{true};
        while (continueLoop) {
            route_id rid;
            ActionMessage cmd;
            std::tie(rid, cmd) = txQueue.pop();
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    switch (cmd.messageID) {
                        case NEW_ROUTE: {
                            SendToQueue newQueue;
                            bool newQconnected =
                                newQueue.connect(std::string(cmd.payload.to_string()), false, 3);
                            if (newQconnected) {
                                routes.emplace(route_id{cmd.getExtraData()}, std::move(newQueue));
                            }
                            continue;
                        }
                        case REMOVE_ROUTE:
                            routes.erase(route_id{cmd.getExtraData()});
                            continue;
                        case DISCONNECT:
                            continueLoop = false;
                            continue;
                    }
                }
            }
            if (cmd.action() == CMD_INIT_GRANT) {
                if (!IPCoperating) {
                    ActionMessage op(CMD_PROTOCOL);
                    op.messageID = SET_TO_OPERATING;
                    rxQueue.sendMessage(op, 3);
                }
            }
            std::string buffer = cmd.to_string();
            int priority = isPriorityCommand(cmd) ? 3 : 1;
            if (rid == parent_route_id) {
                if (hasBroker) {
                    brokerQueue.sendMessage(cmd, priority);
                }
            } else if (rid == control_route) {
                rxQueue.sendMessage(cmd, priority);
            } else {
                auto routeFnd = routes.find(rid);
                if (routeFnd != routes.end()) {
                    routeFnd->second.sendMessage(cmd, priority);
                } else {
                    if (hasBroker) {
                        brokerQueue.sendMessage(cmd, priority);
                    }
                }
            }
        }
        setTxStatus(ConnectionStatus::TERMINATED);
    }